

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O3

int ztlex_isdollarhex(ztlex_t *lex)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (*lex->getC)(lex);
  uVar5 = (ulong)uVar1;
  if (uVar1 != 0xffffffff) {
    if (uVar1 == 0x24) {
      iVar2 = 0x24;
      uVar5 = 0;
      do {
        uVar4 = uVar5;
        uVar5 = uVar4 + 1;
        lex->lexeme[uVar4] = (char)iVar2;
        iVar2 = (*lex->getC)(lex);
        ppuVar3 = __ctype_b_loc();
        if (0xfd < uVar4) break;
      } while (((*ppuVar3)[iVar2] & 0x1000) != 0);
      if ((iVar2 != -1) && (((*ppuVar3)[iVar2] & 0x1000) == 0)) {
        (*lex->ungetC)(iVar2,lex);
      }
      if (uVar5 != 1) {
        lex->lexeme[uVar4 + 1] = '\0';
        goto LAB_00103107;
      }
      uVar1 = (uint)lex->lexeme[0];
    }
    (*lex->ungetC)(uVar1,lex);
    uVar5 = 0;
  }
LAB_00103107:
  return (int)uVar5;
}

Assistant:

int ztlex_isdollarhex(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (c != '$')
  {
    lex->ungetC(c, lex);
    return 0;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while (isxdigit(c) && i < MAXLEXEME - 1);

  if (c != EOF && !isxdigit(c))
    lex->ungetC(c, lex);

  if (i < 2)
  {
    while (--i >= 0)
      lex->ungetC(lex->lexeme[i], lex);
    return 0;
  }

  lex->lexeme[i] = '\0';
  return i;
}